

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::int_writer
          (int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *this,
          basic_writer<fmt::v6::buffer_range<wchar_t>_> *w,__int128 value,
          basic_format_specs<wchar_t> *s)

{
  long *plVar1;
  long lVar2;
  undefined1 value_00 [16];
  bool bVar3;
  undefined8 in_RCX;
  internal *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  undefined1 uVar4;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_R8;
  in_RDI[3] = in_RCX;
  in_RDI[2] = in_RDX;
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  value_00[6] = in_stack_ffffffffffffff9e;
  value_00._0_6_ = in_stack_ffffffffffffff98;
  value_00[7] = in_stack_ffffffffffffff9f;
  value_00._8_8_ = in_RDI;
  bVar3 = is_negative<__int128,_0>(in_RDX,(__int128)value_00);
  if (bVar3) {
    *(undefined1 *)(in_RDI + 4) = 0x2d;
    *(int *)((long)in_RDI + 0x24) = *(int *)((long)in_RDI + 0x24) + 1;
    plVar1 = in_RDI + 2;
    lVar2 = *plVar1;
    *plVar1 = -*plVar1;
    in_RDI[3] = -(ulong)(lVar2 != 0) - in_RDI[3];
  }
  else if (((*(byte *)(in_RDI[1] + 9) >> 4 & 7) != 0) && ((*(byte *)(in_RDI[1] + 9) >> 4 & 7) != 1))
  {
    uVar4 = 0x2b;
    if ((*(byte *)(in_RDI[1] + 9) >> 4 & 7) != 2) {
      uVar4 = 0x20;
    }
    *(undefined1 *)(in_RDI + 4) = uVar4;
    *(int *)((long)in_RDI + 0x24) = *(int *)((long)in_RDI + 0x24) + 1;
  }
  return;
}

Assistant:

int_writer(basic_writer<Range>& w, Int value, const Specs& s)
        : writer(w),
          specs(s),
          abs_value(static_cast<unsigned_type>(value)),
          prefix_size(0) {
      if (is_negative(value)) {
        prefix[0] = '-';
        ++prefix_size;
        abs_value = 0 - abs_value;
      } else if (specs.sign != sign::none && specs.sign != sign::minus) {
        prefix[0] = specs.sign == sign::plus ? '+' : ' ';
        ++prefix_size;
      }
    }